

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O2

int ext_loader_impl_destroy(loader_impl impl)

{
  int iVar1;
  loader_impl_ext_type *this;
  _Base_ptr p_Var2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
  iterator;
  
  this = (loader_impl_ext_type *)loader_impl_get();
  if (this == (loader_impl_ext_type *)0x0) {
    iVar1 = 1;
  }
  else {
    loader_unload_children(impl);
    if ((this->destroy_list)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      for (p_Var2 = (this->destroy_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(this->destroy_list)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
        ::pair(&iterator,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
                *)(p_Var2 + 1));
        log_write_impl_va("metacall",0x17c,"ext_loader_impl_destroy",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/ext_loader/source/ext_loader_impl.cpp"
                          ,0,"Unloading handle: %s <%p>");
        dynlink_unload(iterator.second.handle);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
        ::~pair(&iterator);
      }
    }
    loader_impl_ext_type::~loader_impl_ext_type(this);
    operator_delete(this,0x60);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ext_loader_impl_destroy(loader_impl impl)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	if (ext_impl != NULL)
	{
		/* Destroy children loaders */
		loader_unload_children(impl);

		/* Destroy all handles */
		if (!ext_impl->destroy_list.empty())
		{
			for (auto iterator : ext_impl->destroy_list)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Unloading handle: %s <%p>", iterator.second.name.c_str(), iterator.second.handle);
				dynlink_unload(iterator.second.handle);
			}
		}

		delete ext_impl;

		return 0;
	}

	return 1;
}